

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  undefined4 uVar3;
  TestNode *node;
  long *plVar4;
  undefined8 *puVar5;
  Texture2DFilteringCase *this_00;
  ulong uVar6;
  TextureCubeFilteringCase *this_01;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  long *local_1a8;
  undefined8 local_1a0;
  long local_198;
  undefined8 uStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178 [2];
  TestNode *local_168;
  anon_struct_16_2_3f8b7511 *local_160;
  anon_struct_16_2_3f8b7511 *local_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string name;
  long *local_70 [2];
  long local_60 [2];
  ulong local_50;
  ulong local_48;
  long local_40;
  TestNode *local_38;
  
  local_168 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_168,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,local_168);
  local_38 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  lVar12 = 0;
  do {
    local_160 = init::minFilterModes + lVar12;
    uVar3 = 0xcf5001;
    lVar10 = 0;
    local_40 = lVar12;
    do {
      local_50 = CONCAT44(local_50._4_4_,uVar3);
      uVar6 = 0;
      do {
        local_158 = init::wrapModes + uVar6;
        lVar12 = 0;
        bVar2 = true;
        local_48 = uVar6;
        do {
          bVar11 = bVar2;
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
          plVar4 = (long *)std::__cxx11::string::append((char *)local_70);
          local_150 = &local_140;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_140 = *plVar7;
            lStack_138 = plVar4[3];
          }
          else {
            local_140 = *plVar7;
            local_150 = (long *)*plVar4;
          }
          local_148 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
          local_130 = &local_120;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_120 = *plVar7;
            lStack_118 = plVar4[3];
          }
          else {
            local_120 = *plVar7;
            local_130 = (long *)*plVar4;
          }
          local_128 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_110 = &local_100;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_100 = *plVar7;
            lStack_f8 = plVar4[3];
          }
          else {
            local_100 = *plVar7;
            local_110 = (long *)*plVar4;
          }
          local_108 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_f0 = &local_e0;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_e0 = *plVar7;
            lStack_d8 = plVar4[3];
          }
          else {
            local_e0 = *plVar7;
            local_f0 = (long *)*plVar4;
          }
          local_e8 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_d0 = &local_c0;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_c0 = *plVar7;
            lStack_b8 = plVar4[3];
          }
          else {
            local_c0 = *plVar7;
            local_d0 = (long *)*plVar4;
          }
          local_c8 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_b0 = &local_a0;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_a0 = *plVar7;
            lStack_98 = plVar4[3];
          }
          else {
            local_a0 = *plVar7;
            local_b0 = (long *)*plVar4;
          }
          local_a8 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_1c8 = &local_1b8;
          puVar8 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar8) {
            local_1b8 = *puVar8;
            uStack_1b0 = (undefined4)plVar4[3];
            uStack_1ac = *(undefined4 *)((long)plVar4 + 0x1c);
          }
          else {
            local_1b8 = *puVar8;
            local_1c8 = (ulong *)*plVar4;
          }
          local_1c0 = plVar4[1];
          *plVar4 = (long)puVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          local_188 = local_178;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"_","");
          uVar6 = 0xf;
          if (local_1c8 != &local_1b8) {
            uVar6 = local_1b8;
          }
          if (uVar6 < (ulong)(local_180 + local_1c0)) {
            uVar6 = 0xf;
            if (local_188 != local_178) {
              uVar6 = local_178[0];
            }
            if (uVar6 < (ulong)(local_180 + local_1c0)) goto LAB_0043ea0a;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_1c8)
            ;
          }
          else {
LAB_0043ea0a:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_188);
          }
          local_1a8 = &local_198;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_198 = *plVar4;
            uStack_190 = puVar5[3];
          }
          else {
            local_198 = *plVar4;
            local_1a8 = (long *)*puVar5;
          }
          local_1a0 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar9 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar9) {
            name.field_2._M_allocated_capacity = *psVar9;
            name.field_2._8_8_ = plVar4[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar9;
            name._M_dataplus._M_p = (pointer)*plVar4;
          }
          name._M_string_length = plVar4[1];
          *plVar4 = (long)psVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if (local_188 != local_178) {
            operator_delete(local_188,local_178[0] + 1);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,local_1b8 + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100 + 1);
          }
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          this_00 = (Texture2DFilteringCase *)operator_new(0x128);
          pCVar1 = (this->super_TestCaseGroup).m_context;
          Texture2DFilteringCase::Texture2DFilteringCase
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                     name._M_dataplus._M_p,"",local_160->mode,init::magFilterModes[lVar10].mode,
                     local_158->mode,local_158->mode,0x8058,init::sizes2D[lVar12].width,
                     init::sizes2D[lVar12].height);
          tcu::TestNode::addChild(local_168,(TestNode *)this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          lVar12 = 1;
          bVar2 = false;
        } while (bVar11);
        uVar6 = local_48 + 1;
      } while (uVar6 != 3);
      lVar10 = 1;
      uVar3 = 0;
    } while ((local_50 & 1) != 0);
    lVar12 = local_40 + 1;
  } while (lVar12 != 6);
  local_50 = 0;
  do {
    local_160 = init::minFilterModes + local_50;
    uVar3 = 0xcf5001;
    lVar12 = 0;
    do {
      local_48 = CONCAT44(local_48._4_4_,uVar3);
      local_168 = (TestNode *)0x0;
      do {
        local_158 = init::wrapModes + (long)local_168;
        lVar10 = 0;
        bVar2 = true;
        do {
          bVar11 = bVar2;
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
          plVar4 = (long *)std::__cxx11::string::append((char *)local_70);
          local_150 = &local_140;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_140 = *plVar7;
            lStack_138 = plVar4[3];
          }
          else {
            local_140 = *plVar7;
            local_150 = (long *)*plVar4;
          }
          local_148 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
          local_130 = &local_120;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_120 = *plVar7;
            lStack_118 = plVar4[3];
          }
          else {
            local_120 = *plVar7;
            local_130 = (long *)*plVar4;
          }
          local_128 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_110 = &local_100;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_100 = *plVar7;
            lStack_f8 = plVar4[3];
          }
          else {
            local_100 = *plVar7;
            local_110 = (long *)*plVar4;
          }
          local_108 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_f0 = &local_e0;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_e0 = *plVar7;
            lStack_d8 = plVar4[3];
          }
          else {
            local_e0 = *plVar7;
            local_f0 = (long *)*plVar4;
          }
          local_e8 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_d0 = &local_c0;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_c0 = *plVar7;
            lStack_b8 = plVar4[3];
          }
          else {
            local_c0 = *plVar7;
            local_d0 = (long *)*plVar4;
          }
          local_c8 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_b0 = &local_a0;
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_a0 = *plVar7;
            lStack_98 = plVar4[3];
          }
          else {
            local_a0 = *plVar7;
            local_b0 = (long *)*plVar4;
          }
          local_a8 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_1c8 = &local_1b8;
          puVar8 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar8) {
            local_1b8 = *puVar8;
            uStack_1b0 = (undefined4)plVar4[3];
            uStack_1ac = *(undefined4 *)((long)plVar4 + 0x1c);
          }
          else {
            local_1b8 = *puVar8;
            local_1c8 = (ulong *)*plVar4;
          }
          local_1c0 = plVar4[1];
          *plVar4 = (long)puVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          local_188 = local_178;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"_","");
          uVar6 = 0xf;
          if (local_1c8 != &local_1b8) {
            uVar6 = local_1b8;
          }
          if (uVar6 < (ulong)(local_180 + local_1c0)) {
            uVar6 = 0xf;
            if (local_188 != local_178) {
              uVar6 = local_178[0];
            }
            if (uVar6 < (ulong)(local_180 + local_1c0)) goto LAB_0043f10b;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_1c8)
            ;
          }
          else {
LAB_0043f10b:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_188);
          }
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_198 = *plVar4;
            uStack_190 = puVar5[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *plVar4;
            local_1a8 = (long *)*puVar5;
          }
          local_1a0 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar9 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar9) {
            name.field_2._M_allocated_capacity = *psVar9;
            name.field_2._8_8_ = plVar4[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar9;
            name._M_dataplus._M_p = (pointer)*plVar4;
          }
          name._M_string_length = plVar4[1];
          *plVar4 = (long)psVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if (local_188 != local_178) {
            operator_delete(local_188,local_178[0] + 1);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8,local_1b8 + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100 + 1);
          }
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          this_01 = (TextureCubeFilteringCase *)operator_new(0x128);
          pCVar1 = (this->super_TestCaseGroup).m_context;
          TextureCubeFilteringCase::TextureCubeFilteringCase
                    (this_01,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                     name._M_dataplus._M_p,"",local_160->mode,init::magFilterModes[lVar12].mode,
                     local_158->mode,local_158->mode,false,0x8058,init::sizesCube[lVar10].width,
                     init::sizesCube[lVar10].height);
          tcu::TestNode::addChild(local_38,(TestNode *)this_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          lVar10 = 1;
          bVar2 = false;
        } while (bVar11);
        local_168 = (TestNode *)((long)local_168 + 1);
      } while (local_168 != (TestNode *)0x3);
      lVar12 = 1;
      uVar3 = 0;
    } while ((local_48 & 1) != 0);
    local_50 = local_50 + 1;
    if (local_50 == 6) {
      return 6;
    }
  } while( true );
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
	} formats[] =
	{
		{ "rgba8",		GL_RGBA8 }
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 false,
															 formats[format].format,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}